

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.hpp
# Opt level: O1

string_view __thiscall
cinatra::websocket::encode_frame
          (websocket *this,span<char,_18446744073709551615UL> *data,opcode op,bool eof,
          bool need_compression)

{
  ulong uVar1;
  string_view sVar2;
  
  sVar2 = encode_ws_header(this,(data->_M_extent)._M_extent_value,op,eof,need_compression,true);
  if ((data->_M_extent)._M_extent_value != 0) {
    uVar1 = 0;
    do {
      data->_M_ptr[uVar1] = data->_M_ptr[uVar1] ^ this->mask_key_[(uint)uVar1 & 3];
      uVar1 = uVar1 + 1;
    } while (uVar1 < (data->_M_extent)._M_extent_value);
  }
  return sVar2;
}

Assistant:

std::string_view encode_frame(std::span<char> &data, opcode op, bool eof,
                                bool need_compression = false) {
    std::string_view ws_header =
        encode_ws_header(data.size(), op, eof, need_compression);
    encode_ws_payload(data);

    return ws_header;
  }